

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

Abc_Cex_t * Fra_SmlGetCounterExample(Fra_Sml_t *p)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  Abc_Cex_t *p_00;
  int iVar6;
  long lVar7;
  uint uVar8;
  int i;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  
  if (p->fNonConstOut == 0) {
    __assert_fail("p->fNonConstOut",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x41b,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  pAVar2 = p->pAig;
  iVar4 = pAVar2->nRegs;
  iVar10 = pAVar2->nObjs[3];
  bVar14 = 0 < iVar10 - iVar4;
  iVar13 = -1;
  uVar8 = iVar10 - iVar4;
  if (uVar8 == 0 || iVar10 < iVar4) {
    uVar12 = 0;
    iVar10 = -1;
    goto LAB_006077a4;
  }
  uVar9 = pAVar2->vCos->nSize;
  uVar12 = 0;
  uVar11 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar11 = uVar12;
  }
  do {
    if (uVar12 == uVar11) goto LAB_0060793f;
    iVar10 = p->nWordsTotal;
    iVar6 = p->nWordsPref;
    lVar5 = (long)iVar6;
    if (iVar6 < iVar10) {
      iVar1 = *(int *)((long)pAVar2->vCos->pArray[uVar12] + 0x24);
      lVar7 = 0;
      do {
        if (*(int *)((long)&p[1].pAig + lVar7 * 4 + (long)(iVar10 * iVar1) * 4 + lVar5 * 4) != 0) {
          if (iVar10 <= iVar6) goto LAB_00607767;
          lVar7 = 0;
          goto LAB_00607756;
        }
        lVar7 = lVar7 + 1;
      } while (iVar10 - iVar6 != (int)lVar7);
    }
    uVar12 = uVar12 + 1;
    bVar14 = uVar12 < uVar8;
  } while (uVar12 != uVar8);
  uVar12 = (ulong)uVar8;
  goto LAB_00607767;
  while (uVar9 = uVar9 + 1, uVar9 != 0x20) {
LAB_00607790:
    if ((uVar8 >> (uVar9 & 0x1f) & 1) != 0) goto LAB_006077a2;
  }
  uVar9 = 0xffffffff;
LAB_006077a2:
  iVar10 = uVar9 + (iVar6 % p->nWordsFrame) * 0x20;
  goto LAB_006077a4;
  while (lVar7 = lVar7 + 1, iVar10 - lVar5 != lVar7) {
LAB_00607756:
    uVar8 = *(uint *)((long)&p[1].pAig + lVar7 * 4 + (long)(iVar1 * iVar10) * 4 + lVar5 * 4);
    if (uVar8 != 0) {
      iVar6 = iVar6 + (int)lVar7;
      iVar13 = iVar6 / p->nWordsFrame;
      uVar9 = 0;
      goto LAB_00607790;
    }
  }
LAB_00607767:
  iVar10 = -1;
LAB_006077a4:
  if (!bVar14) {
    __assert_fail("iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x42f,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  if (p->nFrames <= iVar13) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x430,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  if (p->nWordsFrame * 0x20 <= iVar10) {
    __assert_fail("iBit < 32 * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x431,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  p_00 = Abc_CexAlloc(iVar4,pAVar2->nObjs[2] - iVar4,iVar13 + 1);
  p_00->iPo = (int)uVar12;
  p_00->iFrame = iVar13;
  pAVar2 = p->pAig;
  uVar8 = pAVar2->nObjs[2] - pAVar2->nRegs;
  pVVar3 = pAVar2->vCis;
  if ((int)uVar8 < pVVar3->nSize) {
    uVar12 = (ulong)uVar8;
    do {
      if ((int)uVar8 < 0) {
LAB_0060793f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((*(uint *)((long)&p[1].pAig +
                    (long)p->nWordsTotal * (long)*(int *)((long)pVVar3->pArray[uVar12] + 0x24) * 4 +
                    (long)(iVar10 >> 5) * 4) & 1 << ((byte)iVar10 & 0x1f)) != 0) {
        (&p_00[1].iPo)[uVar12 >> 5 & 0x7ffffff] =
             (&p_00[1].iPo)[uVar12 >> 5 & 0x7ffffff] | 1 << ((byte)uVar12 & 0x1f);
      }
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < pVVar3->nSize);
  }
  if (-1 < iVar13) {
    iVar4 = 0;
    do {
      if (pAVar2->nRegs < pAVar2->nObjs[2]) {
        lVar5 = 0;
        do {
          if (pVVar3->nSize <= lVar5) goto LAB_0060793f;
          if ((*(uint *)((long)&p[1].pAig +
                        (long)(p->nWordsFrame * iVar4 * 0x20 + iVar10 >> 5) * 4 +
                        (long)p->nWordsTotal * (long)*(int *)((long)pVVar3->pArray[lVar5] + 0x24) *
                        4) & 1 << ((byte)iVar10 & 0x1f)) != 0) {
            iVar6 = p_00->nPis * iVar4 + p_00->nRegs + (int)lVar5;
            (&p_00[1].iPo)[iVar6 >> 5] = (&p_00[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (long)pAVar2->nObjs[2] - (long)pAVar2->nRegs);
      }
      bVar14 = iVar4 != iVar13;
      iVar4 = iVar4 + 1;
    } while (bVar14);
  }
  iVar4 = Saig_ManVerifyCex(pAVar2,p_00);
  if (iVar4 == 0) {
    puts("Fra_SmlGetCounterExample(): Counter-example is invalid.");
    Abc_CexFree(p_00);
    p_00 = (Abc_Cex_t *)0x0;
  }
  return p_00;
}

Assistant:

Abc_Cex_t * Fra_SmlGetCounterExample( Fra_Sml_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int iPo, iFrame, iBit, i, k;

    // make sure the simulation manager has it
    assert( p->fNonConstOut );

    // find the first output that failed
    iPo = -1;
    iBit = -1;
    iFrame = -1;
    Aig_ManForEachPoSeq( p->pAig, pObj, iPo )
    {
        if ( Fra_SmlNodeIsZero(p, pObj) )
            continue;
        pSims = Fra_ObjSim( p, pObj->Id );
        for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
            if ( pSims[i] )
            {
                iFrame = i / p->nWordsFrame;
                iBit = 32 * (i % p->nWordsFrame) + Aig_WordFindFirstBit( pSims[i] );
                break;
            }
        break;
    }
    assert( iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig) );
    assert( iFrame < p->nFrames );
    assert( iBit < 32 * p->nWordsFrame );

    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig), iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    Aig_ManForEachLoSeq( p->pAig, pObj, k )
    {
        pSims = Fra_ObjSim( p, pObj->Id );
        if ( Abc_InfoHasBit( pSims, iBit ) )
            Abc_InfoSetBit( pCex->pData, k );
    }
    for ( i = 0; i <= iFrame; i++ )
    {
        Aig_ManForEachPiSeq( p->pAig, pObj, k )
        {
            pSims = Fra_ObjSim( p, pObj->Id );
            if ( Abc_InfoHasBit( pSims, 32 * p->nWordsFrame * i + iBit ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * i + k );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Fra_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}